

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O0

int Aig_TableCountEntries(Aig_Man_t *p)

{
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Aig_Obj_t *pEntry;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < p->nTableSize; local_1c = local_1c + 1) {
    for (_Counter = p->pTable[local_1c]; _Counter != (Aig_Obj_t *)0x0;
        _Counter = (_Counter->field_0).pNext) {
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

int Aig_TableCountEntries( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry;
    int i, Counter = 0;
    for ( i = 0; i < p->nTableSize; i++ )
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
    return Counter;
}